

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O0

optional<diy::mpi::status> * __thiscall diy::mpi::request::test(request *this)

{
  MPI_Request *ppoVar1;
  MPI_Status *pMVar2;
  DIY_MPI_Request *in_RSI;
  optional<diy::mpi::status> *in_RDI;
  int flag;
  status s;
  int local_2c;
  DIY_MPI_Status local_28;
  
  ppoVar1 = mpi_cast(in_RSI);
  pMVar2 = mpi_cast(&local_28);
  MPI_Test(ppoVar1,&local_2c,pMVar2);
  if (local_2c == 0) {
    optional<diy::mpi::status>::optional(in_RDI);
  }
  else {
    optional<diy::mpi::status>::optional(in_RDI,(status *)&local_28);
  }
  return in_RDI;
}

Assistant:

diy::mpi::optional<diy::mpi::status> diy::mpi::request::test()
{
#if DIY_HAS_MPI
  status s;
  int flag;
  MPI_Test(&mpi_cast(handle), &flag, &mpi_cast(s.handle));
  if (flag)
    return s;
#endif
  return optional<status>();
}